

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::DeepScanLineOutputFile::initialize(DeepScanLineOutputFile *this,Header *header)

{
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  long lVar4;
  Format FVar5;
  int iVar6;
  Box2i *pBVar7;
  LineOrder *pLVar8;
  uint *puVar9;
  Compression *pCVar10;
  Compressor *pCVar11;
  LineBuffer *pLVar12;
  long *plVar13;
  void *pvVar14;
  Data *pDVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  
  Header::operator=(&this->_data->header,header);
  Header::setType(&this->_data->header,(string *)&Imf_2_5::DEEPSCANLINE_abi_cxx11_);
  pBVar7 = Header::dataWindow(header);
  pLVar8 = Header::lineOrder(header);
  iVar6 = (pBVar7->min).y;
  iVar1 = (pBVar7->max).y;
  iVar20 = iVar1;
  if (*pLVar8 == INCREASING_Y) {
    iVar20 = iVar6;
  }
  pDVar15 = this->_data;
  pDVar15->currentScanLine = iVar20;
  pDVar15->missingScanLines = (iVar1 - iVar6) + 1;
  pLVar8 = Header::lineOrder(header);
  pDVar15 = this->_data;
  pDVar15->lineOrder = *pLVar8;
  iVar6 = (pBVar7->min).y;
  iVar1 = (pBVar7->max).x;
  iVar20 = (pBVar7->max).y;
  pDVar15->minX = (pBVar7->min).x;
  pDVar15->maxX = iVar1;
  pDVar15->minY = iVar6;
  pDVar15->maxY = iVar20;
  iVar20 = iVar20 - iVar6;
  uVar18 = 0xffffffffffffffff;
  if (-2 < iVar20) {
    uVar18 = (long)iVar20 * 4 + 4;
  }
  puVar9 = (uint *)operator_new__(uVar18);
  puVar2 = (pDVar15->lineSampleCount)._data;
  if (puVar2 != (uint *)0x0) {
    operator_delete__(puVar2);
  }
  (pDVar15->lineSampleCount)._size = (long)iVar20 + 1;
  (pDVar15->lineSampleCount)._data = puVar9;
  pCVar10 = Header::compression(&this->_data->header);
  pCVar11 = newCompressor(*pCVar10,0,&this->_data->header);
  FVar5 = defaultFormat(pCVar11);
  this->_data->format = FVar5;
  iVar6 = numLinesInBuffer(pCVar11);
  this->_data->linesInBuffer = iVar6;
  if (pCVar11 != (Compressor *)0x0) {
    (*pCVar11->_vptr_Compressor[1])(pCVar11);
  }
  pDVar15 = this->_data;
  iVar6 = ((pDVar15->maxY - pDVar15->minY) + pDVar15->linesInBuffer) / pDVar15->linesInBuffer;
  Header::setChunkCount(&pDVar15->header,iVar6);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->_data->lineOffsets,(long)iVar6);
  pDVar15 = this->_data;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&pDVar15->bytesPerLine,(long)((pDVar15->maxY - pDVar15->minY) + 1));
  pDVar15 = this->_data;
  iVar6 = (pDVar15->maxY - pDVar15->minY) + 1;
  if (pDVar15->linesInBuffer <= iVar6) {
    iVar6 = pDVar15->linesInBuffer;
  }
  pDVar15->maxSampleCountTableSize = (long)(((pDVar15->maxX - pDVar15->minX) + 1) * iVar6) << 2;
  pDVar15 = this->_data;
  if ((pDVar15->lineBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pDVar15->lineBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar18 = 0;
    do {
      pLVar12 = (LineBuffer *)operator_new(200);
      iVar6 = pDVar15->linesInBuffer;
      lVar16 = (long)iVar6;
      (pLVar12->exception).field_2._M_allocated_capacity = 0;
      *(undefined8 *)&pLVar12->field_0x70 = 0;
      *(undefined2 *)(&pLVar12->field_0x70 + 8) = 0;
      (pLVar12->buffer)._size = 0;
      (pLVar12->buffer)._data = (char *)0x0;
      pLVar12->dataPtr = (char *)0x0;
      pLVar12->dataSize = 0;
      *(undefined4 *)&pLVar12->field_0x1c = 0;
      pLVar12->endOfLineBufferData = (char *)0x0;
      pLVar12->scanLineMin = 0;
      pLVar12->scanLineMax = 0;
      pLVar12->compressor = (Compressor *)0x0;
      pLVar12->partiallyFull = false;
      pLVar12->hasException = false;
      *(undefined6 *)&pLVar12->field_0x42 = 0;
      (pLVar12->exception)._M_dataplus = (pointer)0x0;
      *(LineBuffer **)&pLVar12->field_0x80 = pLVar12 + 1;
      *(undefined8 *)(&pLVar12->field_0x80 + 8) = 0;
      *(undefined1 *)&pLVar12[1].buffer._size = 0;
      IlmThread_2_5::Semaphore::Semaphore((Semaphore *)&pLVar12[1].dataPtr,1);
      uVar17 = lVar16 * 0x10 + 8;
      if (iVar6 < 0) {
        uVar17 = 0xffffffffffffffff;
      }
      plVar13 = (long *)operator_new__(uVar17);
      *plVar13 = lVar16;
      if (iVar6 != 0) {
        memset(plVar13 + 1,0,lVar16 * 0x10);
      }
      pcVar3 = (pLVar12->buffer)._data;
      if (pcVar3 != (char *)0x0) {
        lVar4 = *(long *)(pcVar3 + -8);
        if (lVar4 != 0) {
          lVar19 = lVar4 << 4;
          do {
            pvVar14 = *(void **)(pcVar3 + -8 + lVar19);
            if (pvVar14 != (void *)0x0) {
              operator_delete__(pvVar14);
            }
            lVar19 = lVar19 + -0x10;
          } while (lVar19 != 0);
        }
        operator_delete__(pcVar3 + -8,lVar4 << 4 | 8);
      }
      (pLVar12->buffer)._size = lVar16;
      (pLVar12->buffer)._data = (char *)(plVar13 + 1);
      (this->_data->lineBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar18] = pLVar12;
      pCVar11 = (Compressor *)this->_data->maxSampleCountTableSize;
      pLVar12 = (this->_data->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar18];
      pvVar14 = operator_new__((ulong)pCVar11);
      if (*(void **)&pLVar12->partiallyFull != (void *)0x0) {
        operator_delete__(*(void **)&pLVar12->partiallyFull);
      }
      pLVar12->compressor = pCVar11;
      *(void **)&pLVar12->partiallyFull = pvVar14;
      pCVar10 = Header::compression(&this->_data->header);
      pCVar11 = newCompressor(*pCVar10,this->_data->maxSampleCountTableSize,&this->_data->header);
      ((this->_data->lineBuffers).
       super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar18]->exception).field_2._M_allocated_capacity =
           (size_type)pCVar11;
      uVar18 = uVar18 + 1;
      pDVar15 = this->_data;
    } while (uVar18 < (ulong)((long)(pDVar15->lineBuffers).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pDVar15->lineBuffers).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void
DeepScanLineOutputFile::initialize (const Header &header)
{
    _data->header = header;

    _data->header.setType(DEEPSCANLINE);
    
    const Box2i &dataWindow = header.dataWindow();

    _data->currentScanLine = (header.lineOrder() == INCREASING_Y)?
                                 dataWindow.min.y: dataWindow.max.y;

    _data->missingScanLines = dataWindow.max.y - dataWindow.min.y + 1;
    _data->lineOrder = header.lineOrder();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    _data->lineSampleCount.resizeErase(_data->maxY - _data->minY + 1);

    Compressor* compressor = newCompressor (_data->header.compression(),
                                            0,
                                            _data->header);
    _data->format = defaultFormat (compressor);
    _data->linesInBuffer = numLinesInBuffer (compressor);
    if (compressor != 0)
        delete compressor;

    int lineOffsetSize = (_data->maxY - _data->minY +
                          _data->linesInBuffer) / _data->linesInBuffer;


    _data->header.setChunkCount(lineOffsetSize);

    _data->lineOffsets.resize (lineOffsetSize);

    _data->bytesPerLine.resize (_data->maxY - _data->minY + 1);

    _data->maxSampleCountTableSize = min(_data->linesInBuffer, _data->maxY - _data->minY + 1) *
                                     (_data->maxX - _data->minX + 1) *
                                     sizeof(unsigned int);

    for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
    {
        _data->lineBuffers[i] = new LineBuffer (_data->linesInBuffer);
        _data->lineBuffers[i]->sampleCountTableBuffer.resizeErase(_data->maxSampleCountTableSize);

        _data->lineBuffers[i]->sampleCountTableCompressor =
        newCompressor (_data->header.compression(),
                               _data->maxSampleCountTableSize,
                               _data->header);
    }
}